

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O1

void __thiscall E64::settings_t::write_current_path_to_settings(settings_t *this)

{
  char cVar1;
  FILE *__stream;
  char *pcVar2;
  
  chdir(this->settings_path);
  __stream = fopen("PATH","w");
  cVar1 = this->current_path[0];
  if (cVar1 != '\0') {
    pcVar2 = this->current_path;
    do {
      pcVar2 = pcVar2 + 1;
      fputc((int)cVar1,__stream);
      cVar1 = *pcVar2;
    } while (cVar1 != '\0');
  }
  fclose(__stream);
  return;
}

Assistant:

void E64::settings_t::write_current_path_to_settings()
{
	chdir(settings_path);
	FILE *temp_file = fopen("PATH", "w");

	char *temp_char = current_path;

	while (*temp_char != '\0') {
		fwrite(temp_char, 1, 1, temp_file);
		temp_char++;
	}
	fclose(temp_file);
}